

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc)

{
  anon_struct_168_2_32182ca3_for_identities *paVar1;
  uint16_t uVar2;
  st_ptls_get_time_t *psVar3;
  st_ptls_encrypt_ticket_t *psVar4;
  char *__s2;
  ptls_key_exchange_algorithm_t *ppVar5;
  size_t sVar6;
  ptls_iovec_t ikm;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ptls_key_exchange_algorithm_t **pppVar11;
  ptls_context_t *ppVar12;
  st_ptls_signature_algorithms_t *psVar13;
  char cVar14;
  uint8_t *puVar15;
  ulong uVar16;
  bool bVar17;
  ptls_iovec_t pVar18;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  st_ptls_client_hello_t *local_258;
  anon_struct_168_2_32182ca3_for_identities *local_250;
  char *local_248;
  ptls_context_t *local_240;
  int *local_238;
  uint32_t age_add;
  ptls_buffer_t decbuf;
  uint64_t issue_at;
  ptls_iovec_t ticket_psk;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t ticket_server_name;
  uint8_t verify_data [64];
  uint8_t binder_key [64];
  uint8_t decbuf_small [256];
  
  uVar16 = ch_trunc.len;
  psVar3 = tls->ctx->get_time;
  local_238 = accept_early_data;
  local_250 = (anon_struct_168_2_32182ca3_for_identities *)(*psVar3->cb)(psVar3);
  decbuf.base = decbuf_small;
  decbuf.off = 0;
  decbuf.capacity = 0x100;
  decbuf._24_8_ = (ulong)(uint)decbuf._28_4_ << 0x20;
  *psk_index = 0;
  local_258 = ch;
  if ((ch->psk).identities.count == 0) {
LAB_0011da25:
    *psk_index = 0xffffffffffffffff;
    *local_238 = 0;
    tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
    uVar16 = 0;
  }
  else {
    paVar1 = &(ch->psk).identities;
    uVar9 = 0;
LAB_0011d796:
    decbuf.off = 0;
    psVar4 = tls->ctx->encrypt_ticket;
    pVar18.len = (ch->psk).identities.list[uVar9].identity.len;
    pVar18.base = paVar1->list[uVar9].identity.base;
    iVar7 = (*psVar4->cb)(psVar4,tls,0,&decbuf,pVar18);
    cVar14 = '\x04';
    if ((((iVar7 == 0) &&
         (iVar7 = decode_session_identifier
                            (&issue_at,&ticket_psk,&age_add,&ticket_server_name,
                             &ticket_key_exchange_id,&ticket_csid,&ticket_negotiated_protocol,
                             decbuf.base,decbuf.base + decbuf.off), sVar6 = ticket_server_name.len,
         iVar7 == 0)) && (issue_at <= local_250)) &&
       (ppVar12 = tls->ctx, (long)local_250 - issue_at <= (ulong)ppVar12->ticket_lifetime * 1000)) {
      *local_238 = 0;
      if ((local_258->psk).early_data_indication != 0) {
        uVar10 = (long)local_250 -
                 (issue_at + (paVar1->list[uVar9].obfuscated_ticket_age - age_add));
        uVar9 = -uVar10;
        if (0 < (long)uVar10) {
          uVar9 = uVar10;
        }
        if (uVar9 < 0x2711) {
          *local_238 = 1;
        }
      }
      if (ticket_server_name.len == 0) {
        if (tls->server_name == (char *)0x0) goto LAB_0011d932;
      }
      else {
        __s2 = tls->server_name;
        if (((__s2 != (char *)0x0) &&
            (local_248 = __s2, local_240 = ppVar12,
            iVar7 = strncmp((char *)ticket_server_name.base,__s2,ticket_server_name.len), iVar7 == 0
            )) && (ppVar12 = local_240, local_248[sVar6] == '\0')) {
LAB_0011d932:
          pppVar11 = ppVar12->key_exchanges;
          ppVar5 = *pppVar11;
          cVar14 = '\x04';
          bVar17 = ppVar5 == (ptls_key_exchange_algorithm_t *)0x0;
          if (!bVar17) {
            uVar2 = ppVar5->id;
            while (uVar2 != ticket_key_exchange_id) {
              pppVar11 = pppVar11 + 1;
              ppVar5 = *pppVar11;
              bVar17 = ppVar5 == (ptls_key_exchange_algorithm_t *)0x0;
              if (bVar17) goto LAB_0011d977;
              uVar2 = ppVar5->id;
            }
            if (!bVar17) {
              tls->key_share = ppVar5;
              cVar14 = '\0';
            }
          }
LAB_0011d977:
          if ((!bVar17) && (cVar14 = '\x04', ticket_csid == tls->cipher_suite->id)) {
            if (ticket_negotiated_protocol.len == 0) {
LAB_0011d9ed:
              sVar6 = (tls->key_schedule->hashes[0].algo)->digest_size;
              if (ticket_psk.len == sVar6) {
                cVar14 = ((ch->psk).identities.list[*psk_index].binder.len == sVar6) * '\x04' +
                         '\x04';
              }
            }
            else {
              ppVar12 = (ptls_context_t *)tls->negotiated_protocol;
              if (ppVar12 != (ptls_context_t *)0x0) {
                local_248 = (char *)ticket_negotiated_protocol.len;
                local_240 = ppVar12;
                iVar7 = strncmp((char *)ticket_negotiated_protocol.base,(char *)ppVar12,
                                ticket_negotiated_protocol.len);
                if ((iVar7 == 0) && (local_248[(long)&local_240->random_bytes] == '\0'))
                goto LAB_0011d9ed;
              }
            }
          }
        }
      }
    }
    if (cVar14 == '\x04') goto code_r0x0011d84c;
    if (cVar14 != '\b') goto LAB_0011db57;
    ikm.len = ticket_psk.len;
    ikm.base = ticket_psk.base;
    uVar8 = key_schedule_extract(tls->key_schedule,ikm);
    if ((uVar8 != 0) ||
       (uVar8 = derive_secret(tls->key_schedule,binder_key,"res binder"), uVar8 != 0))
    goto LAB_0011daf5;
    local_258 = (st_ptls_client_hello_t *)tls->key_schedule;
    local_250 = paVar1;
    if ((local_258->key_shares).base != (uint8_t *)0x0) {
      psVar13 = &local_258->signature_algorithms;
      puVar15 = (uint8_t *)0x0;
      do {
        (*(code *)**(undefined8 **)psVar13->list)
                  (*(undefined8 **)psVar13->list,ch_trunc.base,uVar16);
        puVar15 = puVar15 + 1;
        psVar13 = (st_ptls_signature_algorithms_t *)(psVar13->list + 8);
      } while (puVar15 != (local_258->key_shares).base);
    }
    uVar8 = calc_verify_data(verify_data,tls->key_schedule,binder_key);
    if (uVar8 != 0) {
LAB_0011daf5:
      uVar16 = (ulong)uVar8;
      goto LAB_0011daf8;
    }
    iVar7 = (*ptls_mem_equal)(local_250->list[*psk_index].binder.base,verify_data,
                              (tls->key_schedule->hashes[0].algo)->digest_size);
    uVar16 = 0x33;
    if (iVar7 != 0) {
      uVar16 = 0;
    }
  }
LAB_0011daf8:
  (*ptls_clear_memory)(decbuf.base,decbuf.off);
  if (decbuf.is_allocated != 0) {
    free(decbuf.base);
  }
  decbuf.off = 0;
  decbuf.is_allocated = 0;
  decbuf._28_4_ = 0;
  decbuf.base = (uint8_t *)0x0;
  decbuf.capacity = 0;
  (*ptls_clear_memory)(binder_key,0x40);
  (*ptls_clear_memory)(verify_data,0x40);
LAB_0011db57:
  return (int)uVar16;
code_r0x0011d84c:
  uVar9 = *psk_index + 1;
  *psk_index = uVar9;
  if ((local_258->psk).identities.count <= uVar9) goto LAB_0011da25;
  goto LAB_0011d796;
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t ticket_psk, ticket_server_name, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t decbuf_small[256], binder_key[PTLS_MAX_DIGEST_SIZE], verify_data[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        struct st_ptls_client_hello_psk_t *identity = ch->psk.identities.list + *psk_index;
        /* decrypt and decode */
        decbuf.off = 0;
        if ((tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) != 0)
            continue;
        if (decode_session_identifier(&issue_at, &ticket_psk, &age_add, &ticket_server_name, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check server-name */
        if (ticket_server_name.len != 0) {
            if (tls->server_name == NULL)
                continue;
            if (!vec_is_string(ticket_server_name, tls->server_name))
                continue;
        } else {
            if (tls->server_name != NULL)
                continue;
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (ticket_psk.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if ((ret = key_schedule_extract(tls->key_schedule, ticket_psk)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, binder_key, "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len);
    if ((ret = calc_verify_data(verify_data, tls->key_schedule, binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, verify_data,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    ptls_clear_memory(verify_data, sizeof(verify_data));
    return ret;
}